

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O1

int uv_cancel(uv_req_t *req)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  undefined8 *puVar4;
  uint uVar5;
  uv_mutex_t *mutex;
  int iVar6;
  long *plVar7;
  
  uVar5 = req->type - UV_FS;
  iVar6 = -0x16;
  if (uVar5 < 5) {
    lVar2 = *(long *)(&DAT_00945808 + (ulong)uVar5 * 8);
    plVar1 = (long *)((long)req->reserved + lVar2 + -0x10);
    lVar3 = *(long *)((long)req->reserved + *(long *)(&DAT_009457e0 + (ulong)uVar5 * 8) + -0x10);
    mutex = &::mutex;
    uv_mutex_lock(&::mutex);
    plVar7 = (long *)((long)req->reserved + lVar2 + 8);
    uv_mutex_lock((uv_mutex_t *)(*(long *)((long)req->reserved + lVar2) + 0x88));
    if ((plVar7 == (long *)*plVar7) || (*plVar1 == 0)) {
      uv_mutex_unlock((uv_mutex_t *)(plVar1[2] + 0x88));
      iVar6 = -0x10;
    }
    else {
      *(long **)plVar1[4] = (long *)*plVar7;
      *(long *)(plVar1[3] + 8) = plVar1[4];
      uv_mutex_unlock((uv_mutex_t *)(plVar1[2] + 0x88));
      uv_mutex_unlock(&::mutex);
      *plVar1 = (long)uv__cancelled;
      mutex = (uv_mutex_t *)(lVar3 + 0x88);
      uv_mutex_lock(mutex);
      plVar1[3] = lVar3 + 0x78;
      puVar4 = *(undefined8 **)(lVar3 + 0x80);
      plVar1[4] = (long)puVar4;
      *puVar4 = plVar7;
      *(long **)(lVar3 + 0x80) = plVar7;
      uv_async_send((uv_async_t *)(lVar3 + 0xb0));
      iVar6 = 0;
    }
    uv_mutex_unlock(mutex);
  }
  return iVar6;
}

Assistant:

int uv_cancel(uv_req_t* req) {
  struct uv__work* wreq;
  uv_loop_t* loop;

  switch (req->type) {
  case UV_FS:
    loop =  ((uv_fs_t*) req)->loop;
    wreq = &((uv_fs_t*) req)->work_req;
    break;
  case UV_GETADDRINFO:
    loop =  ((uv_getaddrinfo_t*) req)->loop;
    wreq = &((uv_getaddrinfo_t*) req)->work_req;
    break;
  case UV_GETNAMEINFO:
    loop = ((uv_getnameinfo_t*) req)->loop;
    wreq = &((uv_getnameinfo_t*) req)->work_req;
    break;
  case UV_RANDOM:
    loop = ((uv_random_t*) req)->loop;
    wreq = &((uv_random_t*) req)->work_req;
    break;
  case UV_WORK:
    loop =  ((uv_work_t*) req)->loop;
    wreq = &((uv_work_t*) req)->work_req;
    break;
  default:
    return UV_EINVAL;
  }

  return uv__work_cancel(loop, req, wreq);
}